

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_ds.h
# Opt level: O0

void * stbds_hmput_key(void *a,size_t elemsize,void *key,size_t keysize,int mode)

{
  uchar uVar1;
  stbds_hash_index *ot;
  stbds_hash_bucket *psVar2;
  int iVar3;
  void *pvVar4;
  char *pcVar5;
  ulong uVar6;
  ulong local_c8;
  long local_b8;
  ulong local_b0;
  size_t local_a8;
  ptrdiff_t i_1;
  size_t i;
  size_t limit;
  stbds_hash_bucket *bucket;
  ptrdiff_t tombstone;
  size_t pos;
  size_t step;
  size_t hash;
  size_t slot_count;
  stbds_hash_index *nt;
  stbds_hash_index *table;
  void *raw_a;
  size_t keyoffset;
  int mode_local;
  size_t keysize_local;
  void *key_local;
  size_t elemsize_local;
  void *a_local;
  
  elemsize_local = (size_t)a;
  if (a == (void *)0x0) {
    pvVar4 = stbds_arrgrowf((void *)0x0,elemsize,0,1);
    memset(pvVar4,0,elemsize);
    *(long *)((long)pvVar4 + -0x20) = *(long *)((long)pvVar4 + -0x20) + 1;
    elemsize_local = (long)pvVar4 + elemsize;
  }
  pvVar4 = (void *)(elemsize_local - elemsize);
  ot = *(stbds_hash_index **)((long)pvVar4 + -0x10);
  if ((ot == (stbds_hash_index *)0x0) || (nt = ot, ot->used_count_threshold <= ot->used_count)) {
    if (ot == (stbds_hash_index *)0x0) {
      local_a8 = 8;
    }
    else {
      local_a8 = ot->slot_count << 1;
    }
    nt = stbds_make_hash_index(local_a8,ot);
    if (ot == (stbds_hash_index *)0x0) {
      (nt->string).mode = 0 < mode;
    }
    else {
      free(ot);
    }
    *(stbds_hash_index **)((long)pvVar4 + -0x10) = nt;
  }
  if (mode < 1) {
    local_b0 = stbds_hash_bytes(key,keysize,nt->seed);
  }
  else {
    local_b0 = stbds_hash_string((char *)key,nt->seed);
  }
  step = local_b0;
  pos = 8;
  bucket = (stbds_hash_bucket *)0xffffffffffffffff;
  if (local_b0 < 2) {
    step = local_b0 + 2;
  }
  tombstone = stbds_probe_position(step,nt->slot_count,nt->slot_count_log2);
  do {
    psVar2 = nt->storage;
    uVar6 = (ulong)tombstone >> 3;
    for (i_1 = tombstone & 7; (ulong)i_1 < 8; i_1 = i_1 + 1) {
      if (psVar2[uVar6].hash[i_1] == step) {
        iVar3 = stbds_is_key_equal((void *)elemsize_local,elemsize,key,keysize,0,mode,
                                   psVar2[uVar6].index[i_1]);
        if (iVar3 != 0) {
          *(ptrdiff_t *)((long)pvVar4 + -8) = psVar2[uVar6].index[i_1];
          if (0 < mode) {
            **(undefined8 **)((long)pvVar4 + -0x10) =
                 *(undefined8 *)(elemsize_local + elemsize * psVar2[uVar6].index[i_1]);
          }
          return (void *)((long)pvVar4 + elemsize);
        }
      }
      else {
        if (psVar2[uVar6].hash[i_1] == 0) {
          tombstone = (tombstone & 0xfffffffffffffff8U) + i_1;
          goto LAB_0010e33a;
        }
        if (((long)bucket < 0) && (psVar2[uVar6].index[i_1] == -2)) {
          bucket = (stbds_hash_bucket *)((tombstone & 0xfffffffffffffff8U) + i_1);
        }
      }
    }
    for (i_1 = 0; (ulong)i_1 < (tombstone & 7U); i_1 = i_1 + 1) {
      if (psVar2[uVar6].hash[i_1] == step) {
        iVar3 = stbds_is_key_equal((void *)elemsize_local,elemsize,key,keysize,0,mode,
                                   psVar2[uVar6].index[i_1]);
        if (iVar3 != 0) {
          *(ptrdiff_t *)((long)pvVar4 + -8) = psVar2[uVar6].index[i_1];
          return (void *)((long)pvVar4 + elemsize);
        }
      }
      else {
        if (psVar2[uVar6].hash[i_1] == 0) {
          tombstone = (tombstone & 0xfffffffffffffff8U) + i_1;
LAB_0010e33a:
          if (-1 < (long)bucket) {
            tombstone = (ptrdiff_t)bucket;
            nt->tombstone_count = nt->tombstone_count - 1;
          }
          nt->used_count = nt->used_count + 1;
          if (pvVar4 == (void *)0x0) {
            local_b8 = 0;
          }
          else {
            local_b8 = *(long *)((long)pvVar4 + -0x20);
          }
          if (pvVar4 == (void *)0x0) {
            local_c8 = 0;
          }
          else {
            local_c8 = *(ulong *)((long)pvVar4 + -0x18);
          }
          elemsize_local = (size_t)pvVar4;
          if (local_c8 < local_b8 + 1U) {
            elemsize_local = (size_t)stbds_arrgrowf(pvVar4,elemsize,1,0);
          }
          *(long *)(elemsize_local - 0x20) = local_b8 + 1;
          psVar2 = nt->storage;
          psVar2->hash[(tombstone & 0xffffffffffffff8U) * 2 + (ulong)((uint)tombstone & 7)] = step;
          psVar2->index[(tombstone & 0xffffffffffffff8U) * 2 + (ulong)((uint)tombstone & 7)] =
               local_b8 + -1;
          *(long *)(elemsize_local - 8) = local_b8 + -1;
          uVar1 = (nt->string).mode;
          if (uVar1 == '\x01') {
            *(void **)(elemsize_local + elemsize * local_b8) = key;
            **(undefined8 **)(elemsize_local - 0x10) = key;
          }
          else if (uVar1 == '\x02') {
            pcVar5 = stbds_strdup((char *)key);
            *(char **)(elemsize_local + elemsize * local_b8) = pcVar5;
            **(undefined8 **)(elemsize_local - 0x10) = pcVar5;
          }
          else if (uVar1 == '\x03') {
            pcVar5 = stbds_stralloc(&nt->string,(char *)key);
            *(char **)(elemsize_local + elemsize * local_b8) = pcVar5;
            **(undefined8 **)(elemsize_local - 0x10) = pcVar5;
          }
          else {
            memcpy((void *)(elemsize_local + elemsize * local_b8),key,keysize);
          }
          return (void *)(elemsize_local + elemsize);
        }
        if (((long)bucket < 0) && (psVar2[uVar6].index[i_1] == -2)) {
          bucket = (stbds_hash_bucket *)((tombstone & 0xfffffffffffffff8U) + i_1);
        }
      }
    }
    uVar6 = pos + tombstone;
    pos = pos + 8;
    tombstone = nt->slot_count - 1 & uVar6;
  } while( true );
}

Assistant:

void *stbds_hmput_key(void *a, size_t elemsize, void *key, size_t keysize, int mode)
{
  size_t keyoffset=0;
  void *raw_a;
  stbds_hash_index *table;

  if (a == NULL) {
    a = stbds_arrgrowf(0, elemsize, 0, 1);
    memset(a, 0, elemsize);
    stbds_header(a)->length += 1;
    // adjust a to point AFTER the default element
    a = STBDS_ARR_TO_HASH(a,elemsize);
  }

  // adjust a to point to the default element
  raw_a = a;
  a = STBDS_HASH_TO_ARR(a,elemsize);

  table = (stbds_hash_index *) stbds_header(a)->hash_table;

  if (table == NULL || table->used_count >= table->used_count_threshold) {
    stbds_hash_index *nt;
    size_t slot_count;

    slot_count = (table == NULL) ? STBDS_BUCKET_LENGTH : table->slot_count*2;
    nt = stbds_make_hash_index(slot_count, table);
    if (table)
      STBDS_FREE(NULL, table);
    else
      nt->string.mode = mode >= STBDS_HM_STRING ? STBDS_SH_DEFAULT : 0;
    stbds_header(a)->hash_table = table = nt;
    STBDS_STATS(++stbds_hash_grow);
  }

  // we iterate hash table explicitly because we want to track if we saw a tombstone
  {
    size_t hash = mode >= STBDS_HM_STRING ? stbds_hash_string((char*)key,table->seed) : stbds_hash_bytes(key, keysize,table->seed);
    size_t step = STBDS_BUCKET_LENGTH;
    size_t pos;
    ptrdiff_t tombstone = -1;
    stbds_hash_bucket *bucket;

    // stored hash values are forbidden from being 0, so we can detect empty slots to early out quickly
    if (hash < 2) hash += 2;

    pos = stbds_probe_position(hash, table->slot_count, table->slot_count_log2);

    for (;;) {
      size_t limit, i;
      STBDS_STATS(++stbds_hash_probes);
      bucket = &table->storage[pos >> STBDS_BUCKET_SHIFT];

      // start searching from pos to end of bucket
      for (i=pos & STBDS_BUCKET_MASK; i < STBDS_BUCKET_LENGTH; ++i) {
        if (bucket->hash[i] == hash) {
          if (stbds_is_key_equal(raw_a, elemsize, key, keysize, keyoffset, mode, bucket->index[i])) {
            stbds_temp(a) = bucket->index[i];
            if (mode >= STBDS_HM_STRING)
              stbds_temp_key(a) = * (char **) ((char *) raw_a + elemsize*bucket->index[i] + keyoffset);
            return STBDS_ARR_TO_HASH(a,elemsize);
          }
        } else if (bucket->hash[i] == 0) {
          pos = (pos & ~STBDS_BUCKET_MASK) + i;
          goto found_empty_slot;
        } else if (tombstone < 0) {
          if (bucket->index[i] == STBDS_INDEX_DELETED)
            tombstone = (ptrdiff_t) ((pos & ~STBDS_BUCKET_MASK) + i);
        }
      }

      // search from beginning of bucket to pos
      limit = pos & STBDS_BUCKET_MASK;
      for (i = 0; i < limit; ++i) {
        if (bucket->hash[i] == hash) {
          if (stbds_is_key_equal(raw_a, elemsize, key, keysize, keyoffset, mode, bucket->index[i])) {
            stbds_temp(a) = bucket->index[i];
            return STBDS_ARR_TO_HASH(a,elemsize);
          }
        } else if (bucket->hash[i] == 0) {
          pos = (pos & ~STBDS_BUCKET_MASK) + i;
          goto found_empty_slot;
        } else if (tombstone < 0) {
          if (bucket->index[i] == STBDS_INDEX_DELETED)
            tombstone = (ptrdiff_t) ((pos & ~STBDS_BUCKET_MASK) + i);
        }
      }

      // quadratic probing
      pos += step;
      step += STBDS_BUCKET_LENGTH;
      pos &= (table->slot_count-1);
    }
   found_empty_slot:
    if (tombstone >= 0) {
      pos = tombstone;
      --table->tombstone_count;
    }
    ++table->used_count;

    {
      ptrdiff_t i = (ptrdiff_t) stbds_arrlen(a);
      // we want to do stbds_arraddn(1), but we can't use the macros since we don't have something of the right type
      if ((size_t) i+1 > stbds_arrcap(a))
        *(void **) &a = stbds_arrgrowf(a, elemsize, 1, 0);
      raw_a = STBDS_ARR_TO_HASH(a,elemsize);

      STBDS_ASSERT((size_t) i+1 <= stbds_arrcap(a));
      stbds_header(a)->length = i+1;
      bucket = &table->storage[pos >> STBDS_BUCKET_SHIFT];
      bucket->hash[pos & STBDS_BUCKET_MASK] = hash;
      bucket->index[pos & STBDS_BUCKET_MASK] = i-1;
      stbds_temp(a) = i-1;

      switch (table->string.mode) {
         case STBDS_SH_STRDUP:  stbds_temp_key(a) = *(char **) ((char *) a + elemsize*i) = stbds_strdup((char*) key); break;
         case STBDS_SH_ARENA:   stbds_temp_key(a) = *(char **) ((char *) a + elemsize*i) = stbds_stralloc(&table->string, (char*)key); break;
         case STBDS_SH_DEFAULT: stbds_temp_key(a) = *(char **) ((char *) a + elemsize*i) = (char *) key; break;
         default:                memcpy((char *) a + elemsize*i, key, keysize); break;
      }
    }
    return STBDS_ARR_TO_HASH(a,elemsize);
  }
}